

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::
int_writer<unsigned_long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_>::on_bin
          (int_writer<unsigned_long_long,_duckdb_fmt::v6::basic_format_specs<wchar_t>_> *this)

{
  char cVar1;
  uint uVar2;
  format_specs *pfVar3;
  bool bVar4;
  int num_digits;
  unsigned_type uVar5;
  string_view prefix;
  bin_writer<1> f;
  
  pfVar3 = this->specs;
  if ((char)pfVar3->field_0x9 < '\0') {
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = '0';
    cVar1 = pfVar3->type;
    uVar2 = this->prefix_size;
    this->prefix_size = uVar2 + 1;
    this->prefix[uVar2] = cVar1;
  }
  num_digits = 0;
  uVar5 = this->abs_value;
  do {
    num_digits = num_digits + 1;
    bVar4 = 1 < uVar5;
    uVar5 = uVar5 >> 1;
  } while (bVar4);
  prefix.data_ = this->prefix;
  prefix.size_._0_4_ = this->prefix_size;
  prefix.size_._4_4_ = 0;
  f.num_digits = num_digits;
  f.abs_value = this->abs_value;
  f._12_4_ = 0;
  basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::
  write_int<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned_long_long,duckdb_fmt::v6::basic_format_specs<wchar_t>>::bin_writer<1>>
            ((basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>> *)this->writer,num_digits,prefix,
             *pfVar3,f);
  return;
}

Assistant:

void on_bin() {
      if (specs.alt) {
        prefix[prefix_size++] = '0';
        prefix[prefix_size++] = static_cast<char>(specs.type);
      }
      int num_digits = count_digits<1>(abs_value);
      writer.write_int(num_digits, get_prefix(), specs,
                       bin_writer<1>{abs_value, num_digits});
    }